

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineContinuity
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  int *piVar1;
  ostringstream *this_00;
  int i;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  IVec2 cursor;
  IVec2 advance;
  IVec2 cursorNeighborNeg;
  IVec2 cursorNeighborPos;
  IVec2 advanceNeighbor;
  undefined8 local_208;
  uint local_200 [2];
  ulong local_1f8;
  int local_1f0 [6];
  IVec2 *local_1d8;
  LineRenderCase *local_1d0;
  int *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [384];
  
  bVar7 = begin->m_data[0] == end->m_data[0];
  local_200[0] = (uint)!bVar7;
  local_200[1] = (uint)bVar7;
  local_208 = *(undefined8 *)begin->m_data;
  lVar6 = (long)componentNdx;
  local_1f8 = 0;
  iVar5 = 0;
  bVar7 = false;
  local_1d8 = begin;
  local_1d0 = this;
  local_1c8 = messageLimitCounter;
  while( true ) {
    if (((int)local_208 == end->m_data[0]) && (local_208._4_4_ == end->m_data[1])) break;
    iVar3 = (int)access;
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)local_1b0,iVar3,(int)local_208,local_208._4_4_);
    if (*(int *)(local_1b0 + lVar6 * 4) == 0) {
      if (bVar7) {
        local_1b0._0_4_ = A;
        local_1b0._4_4_ = SNORM_INT16;
        local_1f0[4] = 0;
        local_1f0[5] = 0;
        lVar2 = 0;
        do {
          local_1f0[lVar2 + 4] = *(int *)(local_1b0 + lVar2 * 4) - local_200[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        local_1f0[2] = 0;
        local_1f0[3] = 0;
        lVar2 = 0;
        do {
          local_1f0[lVar2 + 2] = local_1f0[lVar2 + 4] + *(int *)((long)&local_208 + lVar2 * 4);
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        local_1f0[0] = 0;
        local_1f0[1] = 0;
        lVar2 = 0;
        do {
          local_1f0[lVar2] = *(int *)((long)&local_208 + lVar2 * 4) - local_1f0[lVar2 + 4];
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_1b0,iVar3,local_1f0[2],local_1f0[3]);
        if (*(int *)(local_1b0 + lVar6 * 4) == 0) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1c0,iVar3,local_1f0[0],local_1f0[1]);
          local_1f8 = (ulong)((int)local_1f8 + (uint)(*(int *)(local_1c0 + lVar6 * 4) == 0));
        }
      }
    }
    else {
      bVar7 = true;
    }
    lVar2 = 0;
    do {
      piVar1 = (int *)((long)&local_208 + lVar2 * 4);
      *piVar1 = *piVar1 + local_200[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    iVar5 = iVar5 + 1;
  }
  iVar3 = (int)local_1f8;
  if ((0 < iVar3) && (*local_1c8 = *local_1c8 + -1, -1 < *local_1c8)) {
    local_1b0._0_8_ =
         ((local_1d0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Found non-continuous ",0x15);
    pcVar4 = "vertical";
    if (local_200[0] == 1) {
      pcVar4 = "horizontal";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar4,(ulong)(local_200[0] == 1) * 2 + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," line near ",0xb);
    tcu::operator<<((ostream *)this_00,local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Missed pixels: ",0xf);
    std::ostream::operator<<(this_00,iVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    return (iVar3 <= (int)((float)iVar5 * 0.1 +
                          *(float *)(&DAT_009c2bf0 + (ulong)((float)iVar5 * 0.1 < 0.0) * 4))) * ' '
           + ' ';
  }
  return '\0';
}

Assistant:

deUint8 LineRenderCase::checkLineContinuity (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	bool				line					= false;
	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	int					missedPixels			= 0;
	int					totalPixels				= 0;
	deUint8				errorMask				= 0;

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			line = true;
		else if (line && !hit)
		{
			// non-continuous line detected
			const tcu::IVec2 advanceNeighbor	= tcu::IVec2(1, 1) - advance;
			const tcu::IVec2 cursorNeighborPos	= cursor + advanceNeighbor;
			const tcu::IVec2 cursorNeighborNeg	= cursor - advanceNeighbor;
			// hw precision issues may lead to a line being non-straight -> check neighboring pixels
			if ((access.getPixelInt(cursorNeighborPos.x(), cursorNeighborPos.y())[componentNdx] == 0) && (access.getPixelInt(cursorNeighborNeg.x(), cursorNeighborNeg.y())[componentNdx] == 0))
				++missedPixels;
		}
		++totalPixels;
	}

	if (missedPixels > 0 && --messageLimitCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Found non-continuous " << ((advance.x() == 1)  ? ("horizontal") : ("vertical")) << " line near " << begin << ". "
			<< "Missed pixels: " << missedPixels
			<< tcu::TestLog::EndMessage;
		// allow 10% missing pixels for warning
		if (missedPixels <= deRoundFloatToInt32((float)totalPixels * 0.1f))
			errorMask = SCANRESULT_LINE_CONT_WARN_BIT;
		else
			errorMask =  SCANRESULT_LINE_CONT_ERR_BIT;
	}

	return errorMask;
}